

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.cpp
# Opt level: O2

void * P33xThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int local_848;
  double pressure;
  timeval local_838;
  double local_828;
  double local_820;
  interval local_818;
  interval local_800;
  interval local_7e8;
  CHRONO chrono_period;
  char szTemp [256];
  P33X p33x;
  char szSaveFilePath [256];
  
  pressure = 0.0;
  memset(&p33x,0,0x550);
  StartChrono(&chrono_period);
  iVar10 = 100;
  bVar2 = false;
  local_848 = 0;
LAB_0017c4c6:
  bVar2 = !bVar2;
  while( true ) {
    StopChronoQuick(&chrono_period);
    StartChrono(&chrono_period);
    mSleep((long)iVar10);
    if (bPauseP33x == 0) break;
    if (!bVar2) {
      puts("P33x Paused.");
      DisconnectP33x(&p33x);
    }
    if (bExit != 0) goto LAB_0017c851;
    mSleep(100);
    bVar2 = true;
  }
  if (bRestartP33x == 0) {
    if (bVar2) goto LAB_0017c574;
    iVar8 = GetPressureP33x(&p33x,&pressure);
    if (iVar8 != 0) {
      puts("Connection to a P33x lost.");
      DisconnectP33x(&p33x);
      goto LAB_0017c591;
    }
    iVar8 = gettimeofday(&local_838,(__timezone_ptr_t)0x0);
    if (iVar8 != 0) {
      local_838.tv_sec = 0;
      local_838.tv_usec = 0;
    }
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    pressure_mes = pressure;
    local_820 = ((pressure - p33x.PressureRef) * -100000.0) / (p33x.WaterDensity * 9.80665);
    interval::interval(&local_800,&local_820);
    local_828 = -z_pressure_acc;
    interval::interval(&local_818,&local_828,&z_pressure_acc);
    operator+(&local_800,&local_818);
    interval::operator=((interval *)&z_pressure,&local_7e8);
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    if (p33x.bSaveRawData != 0) {
      fprintf((FILE *)p33x.pfSaveFile,"%d;%d;%f;\n",SUB84(pressure,0),local_838.tv_sec & 0xffffffff,
              local_838.tv_usec & 0xffffffff);
      goto LAB_0017c727;
    }
  }
  else {
    if (!bVar2) {
      puts("Restarting a P33x.");
      DisconnectP33x(&p33x);
    }
    bRestartP33x = 0;
LAB_0017c574:
    iVar5 = ConnectP33x(&p33x,"P33x0.txt");
    iVar8 = p33x.threadperiod;
    if (iVar5 != 0) {
      mSleep(1000);
LAB_0017c591:
      local_848 = local_848 + 1;
      if (ExitOnErrorCount <= local_848 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0017c851:
        bVar3 = true;
        goto LAB_0017c854;
      }
      bVar2 = false;
      bVar3 = true;
      goto LAB_0017c739;
    }
    if (p33x.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)p33x.pfSaveFile);
      p33x.pfSaveFile = (FILE *)0x0;
    }
    iVar10 = iVar8;
    if (p33x.bSaveRawData == 0) goto LAB_0017c734;
    if (p33x.szCfgFilePath[0] == '\0') {
      builtin_strncpy(szTemp,"p33x",5);
    }
    else {
      sprintf(szTemp,"%.127s",p33x.szCfgFilePath);
    }
    sVar6 = strlen(szTemp);
    iVar8 = (int)sVar6 + 1;
    uVar9 = sVar6 & 0xffffffff;
    do {
      if ((int)uVar9 < 1) goto LAB_0017c6b1;
      uVar1 = uVar9 - 1;
      iVar8 = iVar8 + -1;
      lVar4 = uVar9 - 1;
      uVar9 = uVar1;
    } while (szTemp[lVar4] != '.');
    if ((uVar1 != 0) && (iVar8 <= (int)sVar6)) {
      memset(szTemp + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
    }
LAB_0017c6b1:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar7 = strtimeex_fns();
    sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar7);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    p33x.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
    if ((FILE *)p33x.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create P33x data file.");
      bVar3 = false;
      goto LAB_0017c854;
    }
    fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)p33x.pfSaveFile);
LAB_0017c727:
    fflush((FILE *)p33x.pfSaveFile);
  }
LAB_0017c734:
  bVar3 = false;
  bVar2 = true;
LAB_0017c739:
  if (bExit != 0) {
LAB_0017c854:
    StopChronoQuick(&chrono_period);
    if (p33x.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)p33x.pfSaveFile);
      p33x.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar3) {
      DisconnectP33x(&p33x);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_0017c4c6;
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X p33x;
	struct timeval tv;
	double pressure = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&p33x, 0, sizeof(P33X));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseP33x)
		{
			if (bConnected)
			{
				printf("P33x Paused.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartP33x)
		{
			if (bConnected)
			{
				printf("Restarting a P33x.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			bRestartP33x = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectP33x(&p33x, "P33x0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = p33x.threadperiod;

				if (p33x.pfSaveFile != NULL)
				{
					fclose(p33x.pfSaveFile); 
					p33x.pfSaveFile = NULL;
				}
				if ((p33x.bSaveRawData)&&(p33x.pfSaveFile == NULL)) 
				{
					if (strlen(p33x.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", p33x.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "p33x");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					p33x.pfSaveFile = fopen(szSaveFilePath, "w");
					if (p33x.pfSaveFile == NULL) 
					{
						printf("Unable to create P33x data file.\n");
						break;
					}
					fprintf(p33x.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(p33x.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureP33x(&p33x, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				z_pressure = Pressure2Height(pressure, p33x.PressureRef, p33x.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (p33x.bSaveRawData)
				{
					fprintf(p33x.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(p33x.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a P33x lost.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}		
		}

		//printf("P33xThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (p33x.pfSaveFile != NULL)
	{
		fclose(p33x.pfSaveFile); 
		p33x.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectP33x(&p33x);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}